

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O1

uint8_t __thiscall wabt::ElemSegment::GetFlags(ElemSegment *this,Module *module)

{
  SegmentKind SVar1;
  Enum EVar2;
  pointer pEVar3;
  byte bVar4;
  byte bVar5;
  Index IVar6;
  pointer pEVar7;
  pointer pEVar8;
  long lVar9;
  bool bVar10;
  
  SVar1 = this->kind;
  EVar2 = (this->elem_type).enum_;
  if (SVar1 == Declared) {
    bVar4 = 3;
  }
  else if (SVar1 == Passive) {
    bVar4 = 1;
  }
  else if (SVar1 == Active) {
    IVar6 = BindingHash::FindIndex(&module->table_bindings,&this->table_var);
    bVar4 = (IVar6 != 0) * '\x02';
  }
  else {
    bVar4 = 0;
  }
  if (EVar2 != Funcref) {
    bVar10 = false;
    goto LAB_00262a27;
  }
  pEVar8 = (this->elem_exprs).super__Vector_base<wabt::ElemExpr,_std::allocator<wabt::ElemExpr>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pEVar3 = (this->elem_exprs).super__Vector_base<wabt::ElemExpr,_std::allocator<wabt::ElemExpr>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  lVar9 = ((long)pEVar3 - (long)pEVar8 >> 4) * -0x3333333333333333 >> 2;
  pEVar7 = pEVar8;
  if (0 < lVar9) {
    pEVar7 = pEVar8 + lVar9 * 4;
    lVar9 = lVar9 + 1;
    pEVar8 = pEVar8 + 2;
    do {
      if (pEVar8[-2].kind != RefFunc) {
        pEVar8 = pEVar8 + -2;
        goto LAB_00262a21;
      }
      if (pEVar8[-1].kind != RefFunc) {
        pEVar8 = pEVar8 + -1;
        goto LAB_00262a21;
      }
      if (pEVar8->kind != RefFunc) goto LAB_00262a21;
      if (pEVar8[1].kind != RefFunc) {
        pEVar8 = pEVar8 + 1;
        goto LAB_00262a21;
      }
      lVar9 = lVar9 + -1;
      pEVar8 = pEVar8 + 4;
    } while (1 < lVar9);
  }
  lVar9 = ((long)pEVar3 - (long)pEVar7 >> 4) * -0x3333333333333333;
  if (lVar9 == 1) {
LAB_002629fe:
    pEVar8 = pEVar7;
    if (pEVar7->kind == RefFunc) {
      pEVar8 = pEVar3;
    }
  }
  else if (lVar9 == 2) {
LAB_002629f5:
    pEVar8 = pEVar7;
    if (pEVar7->kind == RefFunc) {
      pEVar7 = pEVar7 + 1;
      goto LAB_002629fe;
    }
  }
  else {
    pEVar8 = pEVar3;
    if ((lVar9 == 3) && (pEVar8 = pEVar7, pEVar7->kind == RefFunc)) {
      pEVar7 = pEVar7 + 1;
      goto LAB_002629f5;
    }
  }
LAB_00262a21:
  bVar10 = pEVar8 == pEVar3;
LAB_00262a27:
  bVar5 = bVar4 | 4;
  if (bVar10) {
    bVar5 = bVar4;
  }
  return bVar5;
}

Assistant:

uint8_t ElemSegment::GetFlags(const Module* module) const {
  uint8_t flags = 0;

  bool all_ref_func = elem_type == Type::Funcref;

  switch (kind) {
    case SegmentKind::Active: {
      Index table_index = module->GetTableIndex(table_var);
      if (table_index != 0) {
        flags |= SegExplicitIndex;
      }
      break;
    }

    case SegmentKind::Passive:
      flags |= SegPassive;
      break;

    case SegmentKind::Declared:
      flags |= SegDeclared;
      break;
  }

  all_ref_func = all_ref_func &&
                 std::all_of(elem_exprs.begin(), elem_exprs.end(),
                             [](const ElemExpr& elem_expr) {
                               return elem_expr.kind == ElemExprKind::RefFunc;
                             });
  if (!all_ref_func) {
    flags |= SegUseElemExprs;
  }

  return flags;
}